

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

void processingInstructionDebug(void *ctx,xmlChar *target,xmlChar *data)

{
  xmlChar *data_local;
  xmlChar *target_local;
  void *ctx_local;
  
  callbacks = callbacks + 1;
  if (quiet == 0) {
    if (data == (xmlChar *)0x0) {
      fprintf((FILE *)SAXdebug,"SAX.processingInstruction(%s, NULL)\n",target);
    }
    else {
      fprintf((FILE *)SAXdebug,"SAX.processingInstruction(%s, %s)\n",target,data);
    }
  }
  return;
}

Assistant:

static void
processingInstructionDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *target,
                      const xmlChar *data)
{
    callbacks++;
    if (quiet)
	return;
    if (data != NULL)
	fprintf(SAXdebug, "SAX.processingInstruction(%s, %s)\n",
		(char *) target, (char *) data);
    else
	fprintf(SAXdebug, "SAX.processingInstruction(%s, NULL)\n",
		(char *) target);
}